

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::MergeFrom
          (NeuralNetworkClassifier *this,NeuralNetworkClassifier *from)

{
  bool bVar1;
  NeuralNetworkMultiArrayShapeMapping NVar2;
  NeuralNetworkImageShapeMapping NVar3;
  ClassLabelsCase CVar4;
  LogMessage *other;
  long lVar5;
  string *default_value;
  NetworkUpdateParameters *this_00;
  NetworkUpdateParameters *from_00;
  StringVector *this_01;
  StringVector *from_01;
  Int64Vector *this_02;
  Int64Vector *from_02;
  InternalMetadataWithArenaLite *this_03;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  NeuralNetworkClassifier *local_58;
  NeuralNetworkClassifier *from_local;
  NeuralNetworkClassifier *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1158b);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_03 = &this->_internal_metadata_;
  this_local = (NeuralNetworkClassifier *)&local_58->_internal_metadata_;
  local_40 = this_03;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_03,&local_20->unknown_fields);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::MergeFrom
            (&this->layers_,&local_58->layers_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::MergeFrom
            (&this->preprocessing_,&local_58->preprocessing_);
  labelprobabilitylayername_abi_cxx11_(local_58);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->labelprobabilitylayername_,default_value,
               (local_58->labelprobabilitylayername_).ptr_);
  }
  bVar1 = has_updateparams(local_58);
  if (bVar1) {
    this_00 = mutable_updateparams(this);
    from_00 = updateparams(local_58);
    NetworkUpdateParameters::MergeFrom(this_00,from_00);
  }
  NVar2 = arrayinputshapemapping(local_58);
  if (NVar2 != RANK5_ARRAY_MAPPING) {
    NVar2 = arrayinputshapemapping(local_58);
    set_arrayinputshapemapping(this,NVar2);
  }
  NVar3 = imageinputshapemapping(local_58);
  if (NVar3 != RANK5_IMAGE_MAPPING) {
    NVar3 = imageinputshapemapping(local_58);
    set_imageinputshapemapping(this,NVar3);
  }
  CVar4 = ClassLabels_case(local_58);
  if (CVar4 != CLASSLABELS_NOT_SET) {
    if (CVar4 == kStringClassLabels) {
      this_01 = mutable_stringclasslabels(this);
      from_01 = stringclasslabels(local_58);
      StringVector::MergeFrom(this_01,from_01);
    }
    else if (CVar4 == kInt64ClassLabels) {
      this_02 = mutable_int64classlabels(this);
      from_02 = int64classlabels(local_58);
      Int64Vector::MergeFrom(this_02,from_02);
    }
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::MergeFrom(const NeuralNetworkClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (from.labelprobabilitylayername().size() > 0) {

    labelprobabilitylayername_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.labelprobabilitylayername_);
  }
  if (from.has_updateparams()) {
    mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from.updateparams());
  }
  if (from.arrayinputshapemapping() != 0) {
    set_arrayinputshapemapping(from.arrayinputshapemapping());
  }
  if (from.imageinputshapemapping() != 0) {
    set_imageinputshapemapping(from.imageinputshapemapping());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}